

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintFanioNew(FILE *pFile,Abc_Ntk_t *pNtk,int fMffc)

{
  int *piVar1;
  Abc_Obj_t *pAVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *__s;
  ulong uVar7;
  byte bVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  char Buffer [100];
  uint *local_f0;
  void *local_e8;
  double local_c0;
  double local_b8;
  char local_98 [104];
  
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize < 1) {
    local_b8 = 0.0;
    uVar10 = 0;
    uVar6 = 10;
    uVar14 = 0;
    local_c0 = 0.0;
    uVar7 = 0;
  }
  else {
    lVar13 = 0;
    iVar12 = 0;
    iVar15 = 0;
    uVar14 = 0;
    uVar10 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        if (fMffc == 0) {
          uVar6 = (pAVar2->vFanins).nSize;
          if (pNtk->ntkType == ABC_NTK_NETLIST) {
LAB_002f2295:
            uVar4 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x2c);
          }
          else {
            uVar4 = (pAVar2->vFanouts).nSize;
          }
        }
        else {
          if ((pAVar2->vFanouts).nSize == 1) goto LAB_002f22c7;
          uVar6 = (pAVar2->vFanins).nSize;
          if (pNtk->ntkType == ABC_NTK_NETLIST) goto LAB_002f2295;
          uVar4 = Abc_NodeMffcSize(pAVar2);
          pVVar9 = pNtk->vObjs;
        }
        iVar15 = iVar15 + uVar6;
        iVar12 = iVar12 + uVar4;
        if ((int)uVar10 <= (int)uVar6) {
          uVar10 = (ulong)uVar6;
        }
        if ((int)uVar14 <= (int)uVar4) {
          uVar14 = (ulong)uVar4;
        }
      }
LAB_002f22c7:
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
    uVar7 = uVar10;
    if (1 < (uint)uVar10) {
      uVar7 = 0;
      uVar6 = (uint)uVar10 - 1;
      do {
        uVar7 = (ulong)((int)uVar7 + 1);
        bVar3 = 9 < uVar6;
        uVar6 = uVar6 / 10;
      } while (bVar3);
    }
    local_b8 = (double)iVar15;
    local_c0 = (double)iVar12;
    uVar6 = (int)uVar7 * 10 + 10;
    uVar7 = uVar14;
    if (1 < (uint)uVar14) {
      uVar7 = 0;
      uVar4 = (uint)uVar14 - 1;
      do {
        uVar7 = (ulong)((int)uVar7 + 1);
        bVar3 = 9 < uVar4;
        uVar4 = uVar4 / 10;
      } while (bVar3);
    }
  }
  uVar4 = (int)uVar7 * 10 + 10;
  if ((int)uVar4 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar6 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar6 = uVar4;
  }
  if (uVar6 == 0) {
    local_f0 = (uint *)malloc(0x10);
    *local_f0 = 0;
    local_f0[2] = 0;
    local_f0[3] = 0;
    local_f0[1] = uVar4;
    local_e8 = (void *)0x0;
  }
  else {
    local_e8 = malloc((long)(int)uVar6 << 2);
    if (local_e8 != (void *)0x0) {
      memset(local_e8,0,(long)(int)uVar4 * 4);
    }
    local_f0 = (uint *)malloc(0x10);
    *local_f0 = uVar6;
    __s = malloc((long)(int)uVar6 << 2);
    *(void **)(local_f0 + 2) = __s;
    local_f0[1] = uVar4;
    if (__s != (void *)0x0) {
      memset(__s,0,(long)(int)uVar4 << 2);
    }
  }
  puVar11 = local_f0 + 1;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        if (fMffc == 0) {
          uVar6 = (pAVar2->vFanins).nSize;
          if (pNtk->ntkType == ABC_NTK_NETLIST) {
LAB_002f24da:
            uVar5 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x2c);
          }
          else {
            uVar5 = (pAVar2->vFanouts).nSize;
          }
        }
        else {
          if ((pAVar2->vFanouts).nSize == 1) goto LAB_002f2676;
          uVar6 = (pAVar2->vFanins).nSize;
          if (pNtk->ntkType == ABC_NTK_NETLIST) goto LAB_002f24da;
          uVar5 = Abc_NodeMffcSize(pAVar2);
        }
        if ((int)uVar6 < 10) {
          if (((int)uVar6 < 0) || ((int)uVar4 <= (int)uVar6)) goto LAB_002f2932;
          uVar7 = (ulong)uVar6;
LAB_002f25e2:
          piVar1 = (int *)((long)local_e8 + uVar7 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar6 < 100) {
            bVar8 = (char)((uVar6 & 0xff) / 10) + 10;
            uVar7 = (ulong)bVar8;
            if ((int)uVar4 <= (int)(uint)bVar8) goto LAB_002f2932;
            goto LAB_002f25e2;
          }
          if (uVar6 < 1000) {
            uVar6 = (uVar6 & 0xffff) / 100 + 0x14;
LAB_002f2579:
            if ((int)uVar4 <= (int)uVar6) goto LAB_002f2932;
            uVar7 = (ulong)uVar6;
            goto LAB_002f25e2;
          }
          if (uVar6 < 10000) {
            uVar6 = (uVar6 & 0xffff) / 1000 + 0x1e;
            goto LAB_002f2579;
          }
          if (uVar6 < 100000) {
            uVar6 = uVar6 / 10000 + 0x28;
LAB_002f25d7:
            if ((int)uVar4 <= (int)uVar6) goto LAB_002f2932;
            uVar7 = (ulong)uVar6;
            goto LAB_002f25e2;
          }
          if (uVar6 < 1000000) {
            uVar6 = uVar6 / 100000 + 0x32;
            goto LAB_002f25d7;
          }
          if (uVar6 < 10000000) {
            uVar6 = uVar6 / 1000000 + 0x3c;
            goto LAB_002f25d7;
          }
        }
        if ((int)uVar5 < 10) {
          if (((int)uVar5 < 0) || ((int)*puVar11 <= (int)uVar5)) goto LAB_002f2932;
          uVar7 = (ulong)uVar5 << 2;
        }
        else {
          if (uVar5 < 100) {
            uVar6 = (uint)(byte)((char)((uVar5 & 0xff) / 10) + 10);
LAB_002f261e:
            if ((int)*puVar11 <= (int)uVar6) {
LAB_002f2932:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
          }
          else {
            if (uVar5 < 1000) {
              uVar6 = (uVar5 & 0xffff) / 100 + 0x14;
            }
            else {
              if (9999 < uVar5) {
                if (uVar5 < 100000) {
                  uVar6 = uVar5 / 10000 + 0x28;
                }
                else if (uVar5 < 1000000) {
                  uVar6 = uVar5 / 100000 + 0x32;
                }
                else {
                  if (9999999 < uVar5) goto LAB_002f2676;
                  uVar6 = uVar5 / 1000000 + 0x3c;
                }
                goto LAB_002f261e;
              }
              uVar6 = (uVar5 & 0xffff) / 1000 + 0x1e;
            }
            if ((int)*puVar11 <= (int)uVar6) goto LAB_002f2932;
          }
          uVar7 = (ulong)(uVar6 << 2);
        }
        *(int *)(uVar7 + *(long *)(local_f0 + 2)) = *(int *)(uVar7 + *(long *)(local_f0 + 2)) + 1;
      }
LAB_002f2676:
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar13 < pVVar9->nSize);
  }
  fwrite("The distribution of fanins and fanouts in the network:\n",0x37,1,(FILE *)pFile);
  fwrite("         Number   Nodes with fanin  Nodes with fanout\n",0x36,1,(FILE *)pFile);
  if ((int)uVar4 < 1) {
    if (local_e8 == (void *)0x0) goto LAB_002f28d0;
  }
  else {
    uVar7 = 0;
    do {
      if ((*(int *)((long)local_e8 + uVar7 * 4) != 0) ||
         (*(int *)(*(long *)(local_f0 + 2) + uVar7 * 4) != 0)) {
        if (uVar7 < 10) {
          fprintf((FILE *)pFile,"%15d : ",uVar7 & 0xffffffff);
        }
        else {
          iVar12 = (int)((uVar7 & 0xffffffff) / 10) * -10;
          dVar17 = (double)(int)((uVar7 & 0xffffffff) / 10);
          dVar16 = pow(10.0,dVar17);
          dVar17 = pow(10.0,dVar17);
          sprintf(local_98,"%d - %d",(ulong)(uint)((iVar12 + (int)uVar7) * (int)dVar16),
                  (ulong)((iVar12 + (int)uVar7 + 1) * (int)dVar17 - 1));
          fprintf((FILE *)pFile,"%15s : ",local_98);
        }
        if (*(int *)((long)local_e8 + uVar7 * 4) == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ");
        }
        fwrite("    ",4,1,(FILE *)pFile);
        if (*(int *)(*(long *)(local_f0 + 2) + uVar7 * 4) == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ");
        }
        fputc(10,(FILE *)pFile);
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  free(local_e8);
LAB_002f28d0:
  if (*(void **)(local_f0 + 2) != (void *)0x0) {
    free(*(void **)(local_f0 + 2));
  }
  free(local_f0);
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
          local_b8 / (double)pNtk->nObjCounts[7],local_c0 / (double)pNtk->nObjCounts[7],uVar10,
          uVar14);
  return;
}

Assistant:

void Abc_NtkPrintFanioNew( FILE * pFile, Abc_Ntk_t * pNtk, int fMffc )
{
    char Buffer[100];
    Abc_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    fprintf( pFile, "The distribution of fanins and fanouts in the network:\n" );
    fprintf( pFile, "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanins->pArray[k] );
        fprintf( pFile, "    " );
        if ( vFanouts->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanouts->pArray[k] );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
        nFaninsMax,  1.0*nFaninsAll/Abc_NtkNodeNum(pNtk),
        nFanoutsMax, 1.0*nFanoutsAll/Abc_NtkNodeNum(pNtk)  );
/*
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        printf( "%d ", Abc_ObjFanoutNum(pNode) );
    }
    printf( "\n" );
*/
}